

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

type __thiscall
jsoncons::
sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
::try_emplace<std::allocator<char>,bool_const&>
          (sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
           *this,string_view_type *name,bool *args)

{
  size_t __n;
  size_t sVar1;
  char *__s2;
  int iVar2;
  iterator __position;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  type tVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __position._M_current =
       (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)std::
          __lower_bound<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_comp_val<jsoncons::sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>::Comp>>
                    (*(undefined8 *)(this + 8),*(undefined8 *)(this + 0x10),name);
  if (__position._M_current ==
      *(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        **)(this + 0x10)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,name->_M_str,name->_M_str + name->_M_len);
    std::
    vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::string,bool_const&>
              ((vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)(this + 8),&local_50,args);
    uVar3 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar3 = extraout_RDX_02;
    }
    __position._M_current =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)(*(long *)(this + 0x10) + -0x30);
  }
  else {
    __n = ((__position._M_current)->key_)._M_string_length;
    sVar1 = name->_M_len;
    __s2 = name->_M_str;
    if (__n == sVar1) {
      if (__n != 0) {
        iVar2 = bcmp(((__position._M_current)->key_)._M_dataplus._M_p,__s2,__n);
        if (iVar2 != 0) goto LAB_00768b71;
      }
      uVar3 = 0;
      goto LAB_00768c0c;
    }
LAB_00768b71:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s2,__s2 + sVar1);
    __position = std::
                 vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                 ::_M_emplace_aux<std::__cxx11::string,bool_const&>
                           ((vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                             *)(this + 8),(const_iterator)__position._M_current,&local_50,args);
    uVar3 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar3 = extraout_RDX_00;
    }
  }
  uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
LAB_00768c0c:
  tVar4._8_8_ = uVar3;
  tVar4.first._M_current = __position._M_current;
  return tVar4;
}

Assistant:

typename std::enable_if<std::allocator_traits<A>::is_always_equal::value,std::pair<iterator,bool>>::type
        try_emplace(const string_view_type& name, Args&&... args)
        {
            bool inserted;
            auto it = std::lower_bound(members_.begin(),members_.end(), name, 
                                       Comp());        
            if (it == members_.end())
            {
                members_.emplace_back(key_type(name.begin(),name.end()), std::forward<Args>(args)...);
                it = members_.begin() + members_.size() - 1;
                inserted = true;
            }
            else if ((*it).key() == name)
            {
                inserted = false;
            }
            else
            {
                it = members_.emplace(it, key_type(name.begin(),name.end()),
                                            std::forward<Args>(args)...);
                inserted = true;
            }
            return std::make_pair(it,inserted);
        }